

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

bool tinyformat::detail::parseWidthOrPrecision
               (int *n,char **c,bool positionalMode,FormatArg *args,int *argIndex,int numArgs)

{
  int iVar1;
  char *pcVar2;
  runtime_error *this;
  ulong uVar3;
  char cVar4;
  
  pcVar2 = *c;
  cVar4 = *pcVar2;
  if ((byte)(cVar4 - 0x30U) < 10) {
    iVar1 = 0;
    if ((byte)(cVar4 - 0x30U) < 10) {
      iVar1 = 0;
      do {
        pcVar2 = pcVar2 + 1;
        iVar1 = (uint)(byte)(cVar4 - 0x30) + iVar1 * 10;
        *c = pcVar2;
        cVar4 = *pcVar2;
      } while ((byte)(cVar4 - 0x30U) < 10);
    }
    *n = iVar1;
    return true;
  }
  if (cVar4 == '*') {
    *c = pcVar2 + 1;
    *n = 0;
    if (positionalMode) {
      cVar4 = pcVar2[1];
      uVar3 = 0;
      if ((byte)(cVar4 - 0x30U) < 10) {
        pcVar2 = pcVar2 + 2;
        uVar3 = 0;
        do {
          uVar3 = (ulong)((uint)(byte)(cVar4 - 0x30) + (int)uVar3 * 10);
          *c = pcVar2;
          cVar4 = *pcVar2;
          pcVar2 = pcVar2 + 1;
        } while ((byte)(cVar4 - 0x30U) < 10);
      }
      if (**c == '$') {
        if ((0 < (int)uVar3) && ((int)uVar3 <= numArgs)) {
          iVar1 = (*args[uVar3 - 1].m_toIntImpl)(args[uVar3 - 1].m_value);
          *n = iVar1;
          *c = *c + 1;
          return true;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"tinyformat: Positional argument out of range");
      }
      else {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"tinyformat: Non-positional argument used after a positional one");
      }
    }
    else {
      iVar1 = *argIndex;
      if (iVar1 < numArgs) {
        *argIndex = iVar1 + 1;
        iVar1 = (*args[iVar1].m_toIntImpl)(args[iVar1].m_value);
        *n = iVar1;
        return true;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"tinyformat: Not enough arguments to read variable width or precision");
    }
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return false;
}

Assistant:

inline bool parseWidthOrPrecision(int& n, const char*& c, bool positionalMode,
                                  const detail::FormatArg* args,
                                  int& argIndex, int numArgs)
{
    if (*c >= '0' && *c <= '9') {
        n = parseIntAndAdvance(c);
    }
    else if (*c == '*') {
        ++c;
        n = 0;
        if (positionalMode) {
            int pos = parseIntAndAdvance(c) - 1;
            if (*c != '$')
                TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
            if (pos >= 0 && pos < numArgs)
                n = args[pos].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
        }
        else {
            if (argIndex < numArgs)
                n = args[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width or precision");
        }
    }
    else {
        return false;
    }
    return true;
}